

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_CanonicalizeBasicTypes_Test::TestBody
          (IsorecursiveTest_CanonicalizeBasicTypes_Test *this)

{
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Type> types;
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  reference pvVar4;
  char *in_R9;
  Entry EVar5;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_1;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_268;
  AssertHelper local_248;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Type local_1f8;
  uintptr_t local_1f0;
  uintptr_t local_1e8;
  uintptr_t *local_1e0;
  undefined8 local_1d8;
  Type local_1d0;
  Signature local_1c8;
  Entry local_1b8;
  Type local_1a8;
  Type local_1a0;
  Signature local_198;
  Entry local_188;
  allocator<wasm::Field> local_171;
  uintptr_t local_170;
  Field local_168;
  iterator local_158;
  size_type local_150;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_148;
  Struct local_130;
  Entry local_118;
  allocator<wasm::Field> local_101;
  uintptr_t local_100;
  Field local_f8;
  iterator local_e8;
  size_type local_e0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_d8;
  Struct local_c0;
  Entry local_a8;
  HeapType local_98;
  Type local_90;
  Type anyrefCanon;
  Tuple local_68;
  uintptr_t local_50;
  Type anyrefs;
  Entry local_38;
  uintptr_t local_28;
  Type local_20;
  Type anyref;
  TypeBuilder builder;
  IsorecursiveTest_CanonicalizeBasicTypes_Test *this_local;
  
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&anyref,5);
  local_38 = wasm::TypeBuilder::operator[]((TypeBuilder *)&anyref,0);
  local_28 = (uintptr_t)wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_38);
  anyrefCanon.id = wasm::TypeBuilder::getTempRefType((HeapType)&anyref,(Nullability)local_28);
  types._M_len = 2;
  types._M_array = &anyrefCanon;
  local_20.id = anyrefCanon.id;
  wasm::Tuple::Tuple(&local_68,types);
  local_50 = wasm::TypeBuilder::getTempTupleType((Tuple *)&anyref);
  wasm::Tuple::~Tuple(&local_68);
  wasm::HeapType::HeapType(&local_98,any);
  wasm::Type::Type(&local_90,local_98,Nullable);
  local_a8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&anyref,0);
  wasm::TypeBuilder::Entry::operator=(&local_a8,any);
  local_100 = local_20.id;
  wasm::Field::Field(&local_f8,local_20,Immutable);
  local_e8 = &local_f8;
  local_e0 = 1;
  std::allocator<wasm::Field>::allocator(&local_101);
  __l_00._M_len = local_e0;
  __l_00._M_array = local_e8;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_d8,__l_00,&local_101);
  wasm::Struct::Struct(&local_c0,&local_d8);
  local_118 = wasm::TypeBuilder::operator[]((TypeBuilder *)&anyref,1);
  wasm::TypeBuilder::Entry::operator=(&local_118,&local_c0);
  wasm::Struct::~Struct(&local_c0);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_d8);
  std::allocator<wasm::Field>::~allocator(&local_101);
  local_170 = local_90.id;
  wasm::Field::Field(&local_168,local_90,Immutable);
  local_158 = &local_168;
  local_150 = 1;
  std::allocator<wasm::Field>::allocator(&local_171);
  __l._M_len = local_150;
  __l._M_array = local_158;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_148,__l,&local_171);
  wasm::Struct::Struct(&local_130,&local_148);
  local_188 = wasm::TypeBuilder::operator[]((TypeBuilder *)&anyref,2);
  wasm::TypeBuilder::Entry::operator=(&local_188,&local_130);
  wasm::Struct::~Struct(&local_130);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_148);
  std::allocator<wasm::Field>::~allocator(&local_171);
  local_1a0.id = local_50;
  wasm::Type::Type(&local_1a8,none);
  wasm::Signature::Signature(&local_198,local_1a0,local_1a8);
  local_1b8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&anyref,3);
  wasm::TypeBuilder::Entry::operator=(&local_1b8,local_198);
  local_1f0 = local_90.id;
  local_1e8 = local_90.id;
  local_1e0 = &local_1f0;
  local_1d8 = 2;
  wasm::Type::Type(&local_1d0,local_1e0,2);
  wasm::Type::Type(&local_1f8,none);
  wasm::Signature::Signature(&local_1c8,local_1d0,local_1f8);
  EVar5 = wasm::TypeBuilder::operator[]((TypeBuilder *)&anyref,4);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar5.builder;
  wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),local_1c8);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_238,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_268,(internal *)local_238,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x210,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  if (bVar1) {
    __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_298,"built[1]","built[2]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x213,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,3);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,4);
    testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
              ((EqHelper *)local_2b8,"built[3]","built[4]",pvVar3,pvVar4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
    if (!bVar1) {
      testing::Message::Message(&local_2c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x214,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
      testing::internal::AssertHelper::~AssertHelper(&local_2c8);
      testing::Message::~Message(&local_2c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&anyref);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeBasicTypes) {
  TypeBuilder builder(5);

  Type anyref = builder.getTempRefType(builder[0], Nullable);
  Type anyrefs = builder.getTempTupleType({anyref, anyref});

  Type anyrefCanon = Type(HeapType::any, Nullable);

  builder[0] = HeapType::any;
  builder[1] = Struct({Field(anyref, Immutable)});
  builder[2] = Struct({Field(anyrefCanon, Immutable)});
  builder[3] = Signature(anyrefs, Type::none);
  builder[4] = Signature({anyrefCanon, anyrefCanon}, Type::none);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[1], built[2]);
  EXPECT_EQ(built[3], built[4]);
}